

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O3

void __thiscall JsrtDebuggerObjectsManager::ClearAll(JsrtDebuggerObjectsManager *this)

{
  int iVar1;
  JsrtDebuggerObjectBase *buffer;
  uint uVar2;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  ulong uVar3;
  int iVar4;
  DebuggerObjectsDictionary *this_01;
  
  if (this->dataToDebuggerObjectsDictionary !=
      (BaseDictionary<void_*,_JsrtDebuggerObjectBase_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       *)0x0) {
    JsUtil::
    BaseDictionary<void_*,_JsrtDebuggerObjectBase_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Clear(this->dataToDebuggerObjectsDictionary);
  }
  this_01 = this->handleToDebuggerObjectsDictionary;
  if (this_01 != (DebuggerObjectsDictionary *)0x0) {
    uVar2 = this_01->bucketCount;
    if (uVar2 != 0) {
      uVar3 = 0;
      do {
        iVar4 = this_01->buckets[uVar3];
        if (iVar4 != -1) {
          do {
            iVar1 = this_01->entries[iVar4].
                    super_DefaultHashedEntry<unsigned_int,_JsrtDebuggerObjectBase_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    .super_KeyValueEntry<unsigned_int,_JsrtDebuggerObjectBase_*>.
                    super_ValueEntry<JsrtDebuggerObjectBase_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_JsrtDebuggerObjectBase_*>_>
                    .super_KeyValueEntryDataLayout2<unsigned_int,_JsrtDebuggerObjectBase_*>.next;
            buffer = this_01->entries[iVar4].
                     super_DefaultHashedEntry<unsigned_int,_JsrtDebuggerObjectBase_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                     .super_KeyValueEntry<unsigned_int,_JsrtDebuggerObjectBase_*>.
                     super_ValueEntry<JsrtDebuggerObjectBase_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_JsrtDebuggerObjectBase_*>_>
                     .super_KeyValueEntryDataLayout2<unsigned_int,_JsrtDebuggerObjectBase_*>.value;
            this_00 = &JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager)->
                       super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
            (**buffer->_vptr_JsrtDebuggerObjectBase)(buffer);
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                      (this_00,buffer,0x18);
            iVar4 = iVar1;
          } while (iVar1 != -1);
          uVar2 = this_01->bucketCount;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < uVar2);
      this_01 = this->handleToDebuggerObjectsDictionary;
    }
    JsUtil::
    BaseDictionary<unsigned_int,_JsrtDebuggerObjectBase_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Clear(this_01);
  }
  this->handleId = 0;
  return;
}

Assistant:

void JsrtDebuggerObjectsManager::ClearAll()
{
    if (this->dataToDebuggerObjectsDictionary != nullptr)
    {
        this->dataToDebuggerObjectsDictionary->Clear();
    }

    if (this->handleToDebuggerObjectsDictionary != nullptr)
    {
        this->handleToDebuggerObjectsDictionary->Map([this](uint handle, JsrtDebuggerObjectBase* debuggerObject) {
            Adelete(this->GetDebugObjectArena(), debuggerObject);
        });
        this->handleToDebuggerObjectsDictionary->Clear();
    }

    this->handleId = 0;
}